

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O1

void sensors_analytics::Sdk::ItemSet(string *item_type,string *item_id,PropertiesNode *properties)

{
  Sdk *this;
  string local_50;
  
  this = instance_;
  if (instance_ != (Sdk *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"item_set","");
    AddItemEvent(this,&local_50,item_type,item_id,&properties->super_ObjectNode);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void Sdk::ItemSet(const std::string &item_type, const std::string &item_id,
                  sensors_analytics::PropertiesNode &properties) {
  if (instance_) {
    instance_->AddItemEvent("item_set", item_type, item_id, properties);
  }
}